

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  _Elt_pointer pptVar2;
  exception_t<cfgfile::string_trait_t> *peVar3;
  allocator local_fa;
  allocator local_f9;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              (local_b8,"Unexpected end of file. Still unfinished tag \"",&local_f9);
    std::__cxx11::string::string((string *)&local_98,local_b8);
    pptVar2 = (this->m_stack).c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar2 ==
        (this->m_stack).c.
        super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pptVar2 = (this->m_stack).c.
                super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::operator+(&local_78,&local_98,&pptVar2[-1]->m_name);
    std::__cxx11::string::string(local_f8,"\".",&local_fa);
    std::__cxx11::string::string((string *)&local_d8,local_f8);
    std::operator+(&local_38,&local_78,&local_d8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_38);
    __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (this->m_tag->m_is_mandatory == true) {
    bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(this->m_tag);
    if (!bVar1) {
      peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_b8,"Undefined mandatory tag: \"",&local_f9);
      std::__cxx11::string::string((string *)&local_98,local_b8);
      std::operator+(&local_78,&local_98,&this->m_tag->m_name);
      std::__cxx11::string::string(local_f8,"\".",&local_fa);
      std::__cxx11::string::string((string *)&local_d8,local_f8);
      std::operator+(&local_58,&local_78,&local_d8);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_58);
      __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}